

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseUnqualifiedName(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    state_local._7_1_ = false;
  }
  else {
    bVar4 = ParseOperatorName(guard.state_,(int *)0x0);
    if ((((bVar4) || (bVar4 = ParseCtorDtorName(guard.state_), bVar4)) ||
        (bVar4 = ParseSourceName(guard.state_), bVar4)) ||
       ((bVar4 = ParseLocalSourceName(guard.state_), bVar4 ||
        (bVar4 = ParseUnnamedTypeName(guard.state_), bVar4)))) {
      state_local._7_1_ = ParseAbiTags(guard.state_);
    }
    else {
      uVar1 = ((guard.state_)->parse_state).mangled_idx;
      uVar2 = ((guard.state_)->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
      bVar4 = ParseTwoCharToken(guard.state_,"DC");
      if ((bVar4) &&
         ((bVar4 = OneOrMore(ParseSourceName,guard.state_), bVar4 &&
          (bVar4 = ParseOneCharToken(guard.state_,'E'), bVar4)))) {
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = uVar1;
        ((guard.state_)->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
        bVar4 = ParseOneCharToken(guard.state_,'F');
        if (((bVar4) && (bVar4 = MaybeAppend(guard.state_,"friend "), bVar4)) &&
           ((bVar4 = ParseSourceName(guard.state_), bVar4 ||
            (bVar4 = ParseOperatorName(guard.state_,(int *)0x0), bVar4)))) {
          state_local._7_1_ = true;
        }
        else {
          ((guard.state_)->parse_state).mangled_idx = uVar1;
          ((guard.state_)->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar3;
          state_local._7_1_ = false;
        }
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseOperatorName(state, nullptr) || ParseCtorDtorName(state) ||
      ParseSourceName(state) || ParseLocalSourceName(state) ||
      ParseUnnamedTypeName(state)) {
    return ParseAbiTags(state);
  }

  // DC <source-name>+ E
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "DC") && OneOrMore(ParseSourceName, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // F <source-name>
  // F <operator-name>
  if (ParseOneCharToken(state, 'F') && MaybeAppend(state, "friend ") &&
      (ParseSourceName(state) || ParseOperatorName(state, nullptr))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}